

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int is_frame_level_cost_upd_freq_set
              (AV1_COMMON *cm,INTERNAL_COST_UPDATE_TYPE cost_upd_level,int use_nonrd_pick_mode,
              int frames_since_key)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  AV1_COMMON *in_RDI;
  bool bVar2;
  int fill_costs;
  bool local_21;
  
  iVar1 = frame_is_intra_only(in_RDI);
  bVar2 = true;
  if (iVar1 == 0) {
    if (in_EDX == 0) {
      bVar2 = ((in_RDI->current_frame).frame_number & 7) == 1;
    }
    else {
      bVar2 = in_ECX < 2;
    }
  }
  if (((in_EDX != 0) || (local_21 = true, in_ESI == 0)) && (local_21 = true, in_ESI != 1)) {
    local_21 = bVar2;
  }
  return (int)local_21;
}

Assistant:

static inline int is_frame_level_cost_upd_freq_set(
    const AV1_COMMON *const cm, const INTERNAL_COST_UPDATE_TYPE cost_upd_level,
    const int use_nonrd_pick_mode, const int frames_since_key) {
  const int fill_costs =
      frame_is_intra_only(cm) ||
      (use_nonrd_pick_mode ? frames_since_key < 2
                           : (cm->current_frame.frame_number & 0x07) == 1);
  return ((!use_nonrd_pick_mode && cost_upd_level != INTERNAL_COST_UPD_OFF) ||
          cost_upd_level == INTERNAL_COST_UPD_TILE || fill_costs);
}